

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.c
# Opt level: O3

void extract_min_heap(U32Pair *min_heap,u32 last_index)

{
  U32Pair UVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  
  *min_heap = min_heap[last_index];
  if (1 < last_index) {
    iVar3 = 0;
    uVar5 = 1;
    uVar6 = 0;
    do {
      if (min_heap[uVar6].count <= min_heap[uVar5].count) {
        uVar5 = (uint)uVar6;
      }
      uVar4 = iVar3 + 2;
      uVar2 = uVar5;
      if ((uVar4 < last_index) && (uVar2 = uVar4, min_heap[uVar5].count <= min_heap[uVar4].count)) {
        uVar2 = uVar5;
      }
      uVar7 = (ulong)uVar2;
      if (uVar2 == (uint)uVar6) {
        return;
      }
      UVar1 = min_heap[uVar7];
      min_heap[uVar7] = min_heap[uVar6];
      min_heap[uVar6] = UVar1;
      iVar3 = uVar2 * 2;
      uVar5 = uVar2 * 2 + 1;
      uVar6 = uVar7;
    } while (uVar5 < last_index);
  }
  return;
}

Assistant:

void extract_min_heap(U32Pair* min_heap, u32 last_index) {
  min_heap[0] = min_heap[last_index];
  u32 index = 0;
  while (index * 2 + 1 < last_index) {
    u32 left_index = index * 2 + 1, right_index = index * 2 + 2;
    u32 min_index = index;
    if (left_index < last_index &&
        min_heap[min_index].count > min_heap[left_index].count) {
      min_index = left_index;
    }
    if (right_index < last_index &&
        min_heap[min_index].count > min_heap[right_index].count) {
      min_index = right_index;
    }
    if (min_index == index) {
      break;
    }
    swap_pair(&min_heap[min_index], &min_heap[index]);
    index = min_index;
  }
}